

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int btreeOverwriteOverflowCell(BtCursor *pCur,BtreePayload *pX)

{
  uint uVar1;
  MemPage *pMVar2;
  BtShared *pBt;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  MemPage *pPage;
  Pgno local_44;
  MemPage *local_40;
  BtreePayload *local_38;
  
  uVar6 = pX->nZero + pX->nData;
  pMVar2 = pCur->pPage;
  local_40 = pMVar2;
  iVar3 = btreeOverwriteContent(pMVar2,(pCur->info).pPayload,pX,0,(uint)(pCur->info).nLocal);
  if (iVar3 == 0) {
    uVar7 = (ulong)(pCur->info).nLocal;
    uVar1 = *(uint *)((pCur->info).pPayload + uVar7);
    local_44 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    pBt = pMVar2->pBt;
    iVar3 = pBt->usableSize - 4;
    local_38 = pX;
    do {
      iVar4 = btreeGetPage(pBt,local_44,&local_40,0);
      pMVar2 = local_40;
      if (iVar4 != 0) {
        return iVar4;
      }
      iVar4 = (int)uVar7;
      if (((int)local_40->pDbPage->nRef == 1) && (local_40->isInit == '\0')) {
        if ((uint)(iVar3 + iVar4) < uVar6) {
          uVar1 = *(uint *)local_40->aData;
          local_44 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
          ;
        }
        else {
          iVar3 = uVar6 - iVar4;
        }
        iVar5 = btreeOverwriteContent(local_40,local_40->aData + 4,local_38,iVar4,iVar3);
      }
      else {
        iVar5 = 0xb;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13796,
                    "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
      }
      if (pMVar2->pDbPage != (DbPage *)0x0) {
        sqlite3PagerUnrefNotNull(pMVar2->pDbPage);
      }
      if (iVar5 != 0) {
        return iVar5;
      }
      uVar7 = (ulong)(uint)(iVar4 + iVar3);
    } while (iVar4 + iVar3 < (int)uVar6);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static SQLITE_NOINLINE int btreeOverwriteOverflowCell(
  BtCursor *pCur,                     /* Cursor pointing to cell to overwrite */
  const BtreePayload *pX              /* Content to write into the cell */
){
  int iOffset;                        /* Next byte of pX->pData to write */
  int nTotal = pX->nData + pX->nZero; /* Total bytes of to write */
  int rc;                             /* Return code */
  MemPage *pPage = pCur->pPage;       /* Page being written */
  BtShared *pBt;                      /* Btree */
  Pgno ovflPgno;                      /* Next overflow page to write */
  u32 ovflPageSize;                   /* Size to write on overflow page */

  assert( pCur->info.nLocal<nTotal );  /* pCur is an overflow cell */

  /* Overwrite the local portion first */
  rc = btreeOverwriteContent(pPage, pCur->info.pPayload, pX,
                             0, pCur->info.nLocal);
  if( rc ) return rc;

  /* Now overwrite the overflow pages */
  iOffset = pCur->info.nLocal;
  assert( nTotal>=0 );
  assert( iOffset>=0 );
  ovflPgno = get4byte(pCur->info.pPayload + iOffset);
  pBt = pPage->pBt;
  ovflPageSize = pBt->usableSize - 4;
  do{
    rc = btreeGetPage(pBt, ovflPgno, &pPage, 0);
    if( rc ) return rc;
    if( sqlite3PagerPageRefcount(pPage->pDbPage)!=1 || pPage->isInit ){
      rc = SQLITE_CORRUPT_PAGE(pPage);
    }else{
      if( iOffset+ovflPageSize<(u32)nTotal ){
        ovflPgno = get4byte(pPage->aData);
      }else{
        ovflPageSize = nTotal - iOffset;
      }
      rc = btreeOverwriteContent(pPage, pPage->aData+4, pX,
                                 iOffset, ovflPageSize);
    }
    sqlite3PagerUnref(pPage->pDbPage);
    if( rc ) return rc;
    iOffset += ovflPageSize;
  }while( iOffset<nTotal );
  return SQLITE_OK;
}